

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

EdwardsPoint * eddsa_decode(ptrlen encoded,ec_curve *curve)

{
  uint desired_x_parity_00;
  uint uVar1;
  mp_int *x;
  EdwardsPoint *P;
  uint desired_x_parity;
  mp_int *y;
  ec_curve *curve_local;
  ptrlen encoded_local;
  
  if (curve->type == EC_EDWARDS) {
    x = mp_from_bytes_le(encoded);
    desired_x_parity_00 = mp_get_bit(x,curve->fieldBytes * 8 - 1);
    mp_set_bit(x,curve->fieldBytes * 8 - 1,0);
    uVar1 = mp_cmp_hs(x,curve->p);
    if (uVar1 == 0) {
      encoded_local.len =
           (size_t)ecc_edwards_point_new_from_y((curve->field_6).e.ec,x,desired_x_parity_00);
      mp_free(x);
    }
    else {
      mp_free(x);
      encoded_local.len = 0;
    }
    return (EdwardsPoint *)encoded_local.len;
  }
  __assert_fail("curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x213,"EdwardsPoint *eddsa_decode(ptrlen, const struct ec_curve *)");
}

Assistant:

static EdwardsPoint *eddsa_decode(ptrlen encoded, const struct ec_curve *curve)
{
    assert(curve->type == EC_EDWARDS);

    mp_int *y = mp_from_bytes_le(encoded);

    /* The topmost bit of the encoding isn't part of y, so it stores
     * the bottom bit of x. Extract it, and zero that bit in y. */
    unsigned desired_x_parity = mp_get_bit(y, curve->fieldBytes * 8 - 1);
    mp_set_bit(y, curve->fieldBytes * 8 - 1, 0);

    /* What's left should now be within the range of the curve's modulus */
    if (mp_cmp_hs(y, curve->p)) {
        mp_free(y);
        return NULL;
    }

    EdwardsPoint *P = ecc_edwards_point_new_from_y(
        curve->e.ec, y, desired_x_parity);
    mp_free(y);

    /* A point constructed in this way will always satisfy the curve
     * equation, unless ecc-arithmetic.c wasn't able to construct one
     * at all, in which case P is now NULL. Either way, return it. */
    return P;
}